

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function-c.cpp
# Opt level: O2

duckdb_state
duckdb_add_scalar_function_to_set(duckdb_scalar_function_set set,duckdb_scalar_function function)

{
  ScalarFunction SStack_138;
  
  if (function != (duckdb_scalar_function)0x0 && set != (duckdb_scalar_function_set)0x0) {
    duckdb::ScalarFunction::ScalarFunction(&SStack_138,(ScalarFunction *)function);
    std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
               (set + 0x20),&SStack_138);
    duckdb::ScalarFunction::~ScalarFunction(&SStack_138);
  }
  return (uint)(function == (duckdb_scalar_function)0x0 || set == (duckdb_scalar_function_set)0x0);
}

Assistant:

duckdb_state duckdb_add_scalar_function_to_set(duckdb_scalar_function_set set, duckdb_scalar_function function) {
	if (!set || !function) {
		return DuckDBError;
	}
	auto &scalar_function_set = GetCScalarFunctionSet(set);
	auto &scalar_function = GetCScalarFunction(function);
	scalar_function_set.AddFunction(scalar_function);
	return DuckDBSuccess;
}